

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool __thiscall OpenMD::FragmentStamp::addTorsionStamp(FragmentStamp *this,TorsionStamp *torsion)

{
  TorsionStamp *local_8;
  
  local_8 = torsion;
  std::vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::push_back
            (&this->torsionStamps_,&local_8);
  return true;
}

Assistant:

bool FragmentStamp::addTorsionStamp(TorsionStamp* torsion) {
    torsionStamps_.push_back(torsion);
    return true;
  }